

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::T0DetJElementCenterForEAS
          (ChElementHexaANCF_3813 *this,ChMatrixNM<double,_8,_3> *d0,ChMatrixNM<double,_6,_6> *T0,
          double *detJ0C)

{
  double *pdVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  Scalar SVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ChVector<double> A3;
  ChMatrixNM<double,_3,_3> j0;
  ChVector<double> A2;
  ChMatrixNM<double,_3,_3> rd0;
  ShapeVector Ny;
  ShapeVector Nx;
  ChVector<double> local_2a8;
  double local_290;
  undefined8 uStack_288;
  double local_280;
  undefined8 uStack_278;
  double local_270;
  undefined8 uStack_268;
  double local_260;
  undefined8 uStack_258;
  double local_250;
  undefined8 uStack_248;
  Matrix<double,_3,_3,_1,_3,_3> *local_240;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> local_238;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ChVector<double> local_1f0;
  ChVector<double> local_1d8;
  Matrix<double,_1,_8,_1,_1,_8> local_1c0;
  Matrix<double,_3,_3,_1,_3,_3> local_148;
  undefined1 local_100 [16];
  double local_f0;
  double local_e8;
  undefined1 local_e0 [16];
  double local_d0;
  double local_c8;
  Matrix<double,_1,_8,_1,_1,_8> local_c0 [2];
  
  local_2a8.m_data[1] = (double)local_c0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[1]
       = (2.0 / (this->m_InertFlexVec).m_data[0]) * 0.125;
  auVar29._0_8_ =
       -local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
        array[1];
  auVar29._8_8_ = 0x8000000000000000;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[0]
       = (double)vmovlpd_avx(auVar29);
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7]
       = (double)vmovlpd_avx(auVar29);
  local_f0 = (2.0 / (this->m_InertFlexVec).m_data[1]) * 0.125;
  auVar30._8_8_ = local_f0;
  auVar30._0_8_ = local_f0;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  local_100 = vxorpd_avx512vl(auVar30,auVar5);
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[4] =
       (2.0 / (this->m_InertFlexVec).m_data[2]) * 0.125;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[0] =
       -local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
        array[4];
  local_2a8.m_data[0] = (double)d0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[1] =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [0];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[2] =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [0];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[3] =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [0];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5] =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [4];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[6] =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [4];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7] =
       local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [4];
  local_e8 = local_f0;
  local_e0 = local_100;
  local_d0 = local_f0;
  local_c8 = local_f0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[2]
       = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[1];
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[3]
       = auVar29._0_8_;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[4]
       = auVar29._0_8_;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5]
       = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[1];
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[6]
       = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[1];
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_238,&local_148,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_238,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
              *)&local_2a8);
  local_2a8.m_data[0] = (double)d0;
  local_2a8.m_data[1] = (double)local_100;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_238,&local_148,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_238,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
              *)&local_2a8);
  local_2a8.m_data[1] = (double)&local_1c0;
  local_2a8.m_data[0] = (double)d0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_238,&local_148,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_238,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
              *)&local_2a8);
  SVar19 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                     (&local_148);
  *detJ0C = SVar19;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4] * local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[6];
  auVar4 = vfmsub231sd_fma(auVar37,auVar7,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7] * local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[0];
  auVar6 = vfmsub231sd_fma(auVar35,auVar31,auVar23);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[1] *
                 local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3];
  auVar23 = vfmsub231sd_fma(auVar9,auVar20,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3] * local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[3];
  auVar5 = vfmadd231sd_fma(auVar11,auVar20,auVar20);
  auVar5 = vfmadd231sd_fma(auVar5,auVar31,auVar31);
  auVar5 = vsqrtsd_avx(auVar5,auVar5);
  dVar24 = 1.0 / auVar5._0_8_;
  dVar28 = local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[0] * dVar24;
  dVar22 = auVar6._0_8_;
  dVar33 = local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[3] * dVar24;
  dVar24 = local_148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[6] * dVar24;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar22 * dVar22;
  auVar5 = vfmadd231sd_fma(auVar6,auVar4,auVar4);
  auVar5 = vfmadd231sd_fma(auVar5,auVar23,auVar23);
  auVar5 = vsqrtsd_avx(auVar5,auVar5);
  local_2a8.m_data[2] = 1.0 / auVar5._0_8_;
  local_2a8.m_data[0] = auVar4._0_8_ * local_2a8.m_data[2];
  local_2a8.m_data[1] = dVar22 * local_2a8.m_data[2];
  local_2a8.m_data[2] = auVar23._0_8_ * local_2a8.m_data[2];
  local_1f0.m_data[0] = dVar28;
  local_1f0.m_data[1] = dVar33;
  local_1f0.m_data[2] = dVar24;
  ChVector<double>::Cross(&local_1d8,&local_2a8,&local_1f0);
  dVar52 = local_2a8.m_data[2];
  dVar50 = local_2a8.m_data[1];
  dVar41 = local_2a8.m_data[0];
  local_250 = dVar28 + local_1d8.m_data[0] * 0.0;
  uStack_248 = 0;
  local_280 = dVar33 + local_1d8.m_data[1] * 0.0;
  uStack_278 = 0;
  dVar22 = dVar24 + local_1d8.m_data[2] * 0.0;
  local_270 = local_1d8.m_data[0] - dVar28 * 0.0;
  uStack_268 = 0;
  local_290 = local_1d8.m_data[1] - dVar33 * 0.0;
  uStack_288 = 0;
  local_260 = local_1d8.m_data[2] - dVar24 * 0.0;
  uStack_258 = 0;
  local_240 = &local_148;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_238,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_240);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_200;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_238.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>,_0>._8_8_;
  auVar36._8_8_ = local_290;
  auVar36._0_8_ = local_290;
  auVar38._8_8_ = local_280;
  auVar38._0_8_ = local_280;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_208;
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_238.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>,_0>.m_data;
  auVar39._8_8_ = local_270;
  auVar39._0_8_ = local_270;
  auVar48._8_8_ = local_250;
  auVar48._0_8_ = local_250;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_1f8;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_238.m_xpr;
  auVar51._8_8_ = local_260;
  auVar51._0_8_ = local_260;
  auVar53._8_8_ = dVar22;
  auVar53._0_8_ = dVar22;
  auVar14._8_8_ = dVar50;
  auVar14._0_8_ = dVar50;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_238.m_startRow.m_value;
  auVar13._8_8_ = dVar41;
  auVar13._0_8_ = dVar41;
  auVar3._8_8_ = dVar52;
  auVar3._0_8_ = dVar52;
  auVar5 = vunpcklpd_avx(auVar38,auVar36);
  auVar4 = vunpcklpd_avx(auVar25,auVar43);
  auVar6 = vunpcklpd_avx(auVar8,auVar42);
  auVar23 = vunpcklpd_avx(auVar42,auVar47);
  auVar21._0_8_ = auVar5._0_8_ * auVar4._0_8_;
  auVar21._8_8_ = auVar5._8_8_ * auVar4._8_8_;
  auVar5 = vunpcklpd_avx(auVar48,auVar39);
  auVar6 = vfmadd213pd_fma(auVar6,auVar5,auVar21);
  auVar5 = vunpcklpd_avx(auVar53,auVar51);
  auVar4 = vunpcklpd_avx(auVar32,auVar46);
  auVar20 = vfmadd213pd_fma(auVar4,auVar5,auVar6);
  auVar4 = vmulsd_avx512f(auVar14,auVar25);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_238.m_startCol.m_value;
  auVar5 = vunpcklpd_avx512vl(auVar54,auVar25);
  auVar26._0_8_ = local_290 * auVar5._0_8_;
  auVar26._8_8_ = local_290 * auVar5._8_8_;
  auVar5 = vunpcklpd_avx(auVar47,auVar8);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar13,auVar8);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_238.m_outerStride;
  auVar6 = vunpcklpd_avx512vl(auVar55,auVar32);
  auVar5 = vfmadd213pd_fma(auVar5,auVar39,auVar26);
  dVar22 = auVar20._0_8_;
  auVar7 = vfmadd231sd_avx512f(auVar4,auVar3,auVar32);
  auVar21 = vfmadd213pd_fma(auVar6,auVar51,auVar5);
  auVar6 = vunpcklpd_avx512vl(auVar43,auVar54);
  auVar8 = vunpcklpd_avx512vl(auVar46,auVar55);
  auVar27._0_8_ = local_280 * auVar6._0_8_;
  auVar27._8_8_ = local_280 * auVar6._8_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar22 + dVar22;
  auVar9 = vmulsd_avx512f(auVar7,auVar49);
  auVar4 = vfmadd231pd_fma(auVar27,auVar23,auVar48);
  auVar5 = vshufpd_avx(auVar20,auVar21,1);
  auVar15 = vbroadcasti64x4_avx512f(_DAT_00ecf300);
  auVar2 = vpermpd_avx2(ZEXT1632(auVar21),0x54);
  pdVar1 = (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
           + 0x1b;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar10 = vshufpd_avx512vl(auVar20,auVar20,1);
  auVar11 = vmulsd_avx512f(auVar10,auVar20);
  auVar9 = vfmadd231pd_fma(auVar4,auVar8,auVar53);
  dVar28 = auVar9._0_8_ + auVar9._0_8_;
  dVar33 = auVar9._8_8_ + auVar9._8_8_;
  auVar4 = vshufpd_avx(auVar9,auVar9,1);
  auVar15 = vpermi2pd_avx512f(auVar15,ZEXT1664(auVar9),ZEXT1664(auVar20));
  auVar12 = vmulsd_avx512f(auVar10,auVar4);
  dVar50 = auVar5._0_8_;
  dVar52 = auVar5._8_8_;
  auVar12 = vfmadd231sd_fma(auVar12,auVar9,auVar21);
  auVar16 = vpermi2pd_avx512f(_DAT_00ecf080,auVar15,ZEXT1664(auVar21));
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xc] =
       dVar50 * dVar28;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xd] =
       dVar52 * dVar33;
  auVar6 = vmulpd_avx512vl(auVar14,auVar6);
  auVar6 = vfmadd231pd_avx512vl(auVar6,auVar13,auVar23);
  auVar13 = vfmadd231pd_avx512vl(auVar6,auVar3,auVar8);
  dVar24 = auVar13._0_8_;
  auVar6 = vshufpd_avx(auVar13,auVar13,1);
  auVar14 = vmulsd_avx512f(auVar10,auVar6);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar4._0_8_ * dVar24;
  auVar23 = vfmadd231sd_fma(auVar44,auVar9,auVar6);
  auVar14 = vfmadd231sd_fma(auVar14,auVar13,auVar21);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1a] =
       auVar23._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1e] =
       (dVar50 + dVar50) * dVar24;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1f] =
       (dVar52 + dVar52) * auVar13._8_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xe] =
       auVar12._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x20] =
       auVar14._0_8_;
  auVar18 = _DAT_00ecf100;
  auVar15 = _DAT_00ecf0c0;
  auVar23 = vshufpd_avx(auVar21,auVar21,1);
  dVar41 = auVar23._0_8_;
  auVar12 = vmulsd_avx512f(auVar13,auVar23);
  auVar14 = vfmadd231sd_avx512f(auVar11,auVar9,auVar23);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xf] =
       dVar41 * (dVar22 + dVar22);
  auVar12 = vfmadd231sd_avx512f(auVar12,auVar7,auVar10);
  auVar17 = vpermpd_avx512f(auVar15,auVar16);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x21] =
       (dVar41 + dVar41) * auVar7._0_8_;
  auVar18 = vpermpd_avx512f(auVar18,auVar16);
  pdVar1 = (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
           + 0x10;
  vmovsd_avx512f(auVar14);
  *pdVar1 = *pdVar1;
  pdVar1 = (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
           + 0x22;
  vmovsd_avx512f(auVar12);
  *pdVar1 = *pdVar1;
  auVar15 = _DAT_00ecf140;
  auVar18 = vmulpd_avx512f(auVar17,auVar18);
  *(undefined1 (*) [64])
   (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array =
       auVar18;
  auVar20 = vunpckhpd_avx(auVar20,auVar21);
  auVar45._16_16_ = auVar5;
  auVar45._0_16_ = auVar20;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[8] =
       auVar20._0_8_ * auVar2._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[9] =
       auVar20._8_8_ * auVar2._8_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[10] =
       dVar50 * auVar2._16_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xb] =
       dVar52 * auVar2._24_8_;
  auVar12._0_8_ = dVar24 * dVar22;
  auVar12._8_8_ = auVar13._8_8_ * dVar22;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar21._0_8_ * dVar22;
  auVar5 = vfmadd231sd_fma(auVar40,auVar23,auVar4);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x11] =
       auVar5._0_8_;
  auVar18 = vbroadcastsd_avx512f(auVar7);
  auVar16 = vblendmpd_avx512f(ZEXT1664(auVar13),auVar18);
  auVar16 = ZEXT3264(CONCAT824(auVar16._24_8_,auVar45._0_24_));
  auVar5 = vfmadd213pd_fma(auVar18._0_16_,auVar9,auVar12);
  auVar15 = vpermpd_avx512f(auVar15,auVar16);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar41 * auVar6._0_8_;
  auVar4 = vfmadd231sd_fma(auVar4,auVar7,auVar21);
  auVar18 = vpermi2pd_avx512f(_DAT_00ecf180,auVar16,ZEXT1664(CONCAT88(dVar33,dVar28)));
  auVar15 = vmulpd_avx512f(auVar15,auVar18);
  *(undefined1 (*) [64])
   ((T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x12
   ) = auVar15;
  *(undefined1 (*) [16])
   ((T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x1c
   ) = auVar5;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x23] =
       auVar4._0_8_;
  return;
}

Assistant:

void ChElementHexaANCF_3813::T0DetJElementCenterForEAS(ChMatrixNM<double, 8, 3>& d0,
                                                       ChMatrixNM<double, 6, 6>& T0,
                                                       double& detJ0C) {
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctionsDerivativeX(Nx, 0, 0, 0);
    ShapeFunctionsDerivativeY(Ny, 0, 0, 0);
    ShapeFunctionsDerivativeZ(Nz, 0, 0, 0);

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = d0.transpose() * Nx.transpose();
    rd0.col(1) = d0.transpose() * Ny.transpose();
    rd0.col(2) = d0.transpose() * Nz.transpose();
    detJ0C = rd0.determinant();

    // Transformation : Orthogonal transformation (A and J) ////
    ChVector<double> G1;
    ChVector<double> G2;
    ChVector<double> G3;
    ChVector<double> G1xG2;
    G1[0] = rd0(0, 0);
    G2[0] = rd0(0, 1);
    G3[0] = rd0(0, 2);
    G1[1] = rd0(1, 0);
    G2[1] = rd0(1, 1);
    G3[1] = rd0(1, 2);
    G1[2] = rd0(2, 0);
    G2[2] = rd0(2, 1);
    G3[2] = rd0(2, 2);
    G1xG2.Cross(G1, G2);

    // Tangent Frame
    ChVector<> A1 = G1 / sqrt(G1[0] * G1[0] + G1[1] * G1[1] + G1[2] * G1[2]);
    ChVector<> A3 = G1xG2 / sqrt(G1xG2[0] * G1xG2[0] + G1xG2[1] * G1xG2[1] + G1xG2[2] * G1xG2[2]);
    ChVector<> A2 = A3.Cross(A1);
    double theta = 0.0;
    ChVector<> AA1 = A1 * cos(theta) + A2 * sin(theta);
    ChVector<> AA2 = -A1 * sin(theta) + A2 * cos(theta);
    ChVector<> AA3 = A3;

    // Beta
    ChMatrixNM<double, 3, 3> j0 = rd0.inverse();
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);
    ChVectorN<double, 9> beta;
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    T0(0, 0) = pow(beta(0), 2);
    T0(1, 0) = pow(beta(1), 2);
    T0(2, 0) = 2.0 * beta(0) * beta(1);
    T0(3, 0) = pow(beta(2), 2);
    T0(4, 0) = 2.0 * beta(0) * beta(2);
    T0(5, 0) = 2.0 * beta(1) * beta(2);

    T0(0, 1) = pow(beta(3), 2);
    T0(1, 1) = pow(beta(4), 2);
    T0(2, 1) = 2.0 * beta(3) * beta(4);
    T0(3, 1) = pow(beta(5), 2);
    T0(4, 1) = 2.0 * beta(3) * beta(5);
    T0(5, 1) = 2.0 * beta(4) * beta(5);

    T0(0, 2) = beta(0) * beta(3);
    T0(1, 2) = beta(1) * beta(4);
    T0(2, 2) = beta(0) * beta(4) + beta(1) * beta(3);
    T0(3, 2) = beta(2) * beta(5);
    T0(4, 2) = beta(0) * beta(5) + beta(2) * beta(3);
    T0(5, 2) = beta(2) * beta(4) + beta(1) * beta(5);

    T0(0, 3) = pow(beta(6), 2);
    T0(1, 3) = pow(beta(7), 2);
    T0(2, 3) = 2.0 * beta(6) * beta(7);
    T0(3, 3) = pow(beta(8), 2);
    T0(4, 3) = 2.0 * beta(6) * beta(8);
    T0(5, 3) = 2.0 * beta(7) * beta(8);

    T0(0, 4) = beta(0) * beta(6);
    T0(1, 4) = beta(1) * beta(7);
    T0(2, 4) = beta(0) * beta(7) + beta(6) * beta(1);
    T0(3, 4) = beta(2) * beta(8);
    T0(4, 4) = beta(0) * beta(8) + beta(2) * beta(6);
    T0(5, 4) = beta(1) * beta(8) + beta(2) * beta(7);

    T0(0, 5) = beta(3) * beta(6);
    T0(1, 5) = beta(4) * beta(7);
    T0(2, 5) = beta(3) * beta(7) + beta(4) * beta(6);
    T0(3, 5) = beta(5) * beta(8);
    T0(4, 5) = beta(3) * beta(8) + beta(6) * beta(5);
    T0(5, 5) = beta(4) * beta(8) + beta(5) * beta(7);
}